

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_no_broadcast<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
               (float *ptr,float *ptr1,float *outptr,int size)

{
  undefined1 auVar1 [16];
  float *pfVar2;
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [64];
  undefined1 (*in_RDI) [64];
  __m128 _outp_2;
  __m128 _b_2;
  __m128 _p_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m256 _p_1;
  __m512 _outp;
  __m512 _b;
  __m512 _p;
  int i;
  binary_op_min op;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [64];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  int local_2b4;
  undefined1 local_2ad;
  int local_2ac;
  float *local_2a8;
  undefined1 (*local_2a0) [64];
  undefined1 (*local_298) [64];
  undefined1 (*local_290) [64];
  undefined1 (*local_288) [64];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  float *local_218;
  undefined1 (*local_210) [64];
  undefined1 (*local_208) [64];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  float *local_1d8;
  undefined1 (*local_1d0) [64];
  undefined1 (*local_1c8) [64];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float *local_1a8;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined1 *local_190;
  undefined8 *local_188;
  undefined8 *local_180;
  undefined1 *local_178;
  undefined8 *local_170;
  undefined8 *local_168;
  undefined1 *local_160;
  undefined1 (*local_158) [64];
  undefined1 (*local_150) [64];
  undefined1 *local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  
  local_2a8 = in_RDX;
  local_2a0 = in_RSI;
  local_298 = in_RDI;
  for (local_2b4 = 0; local_2b4 + 0xf < in_ECX; local_2b4 = local_2b4 + 0x10) {
    local_288 = local_298;
    local_300 = *(undefined8 *)*local_298;
    uStack_2f8 = *(undefined8 *)(*local_298 + 8);
    uStack_2f0 = *(undefined8 *)(*local_298 + 0x10);
    uStack_2e8 = *(undefined8 *)(*local_298 + 0x18);
    uStack_2e0 = *(undefined8 *)(*local_298 + 0x20);
    uStack_2d8 = *(undefined8 *)(*local_298 + 0x28);
    uStack_2d0 = *(undefined8 *)(*local_298 + 0x30);
    uStack_2c8 = *(undefined8 *)(*local_298 + 0x38);
    local_290 = local_2a0;
    local_340 = *(undefined8 *)*local_2a0;
    uStack_338 = *(undefined8 *)(*local_2a0 + 8);
    uStack_330 = *(undefined8 *)(*local_2a0 + 0x10);
    uStack_328 = *(undefined8 *)(*local_2a0 + 0x18);
    uStack_320 = *(undefined8 *)(*local_2a0 + 0x20);
    uStack_318 = *(undefined8 *)(*local_2a0 + 0x28);
    uStack_310 = *(undefined8 *)(*local_2a0 + 0x30);
    uStack_308 = *(undefined8 *)(*local_2a0 + 0x38);
    local_190 = &local_2ad;
    local_198 = &local_300;
    local_1a0 = &local_340;
    local_380 = vminps_avx512f(*local_298,*local_2a0);
    local_218 = local_2a8;
    local_280 = local_380._0_8_;
    uStack_278 = local_380._8_8_;
    uStack_270 = local_380._16_8_;
    uStack_268 = local_380._24_8_;
    uStack_260 = local_380._32_8_;
    uStack_258 = local_380._40_8_;
    uStack_250 = local_380._48_8_;
    uStack_248 = local_380._56_8_;
    *(undefined8 *)local_2a8 = local_380._0_8_;
    *(undefined8 *)(local_2a8 + 2) = local_380._8_8_;
    *(undefined8 *)(local_2a8 + 4) = local_380._16_8_;
    *(undefined8 *)(local_2a8 + 6) = local_380._24_8_;
    *(undefined8 *)(local_2a8 + 8) = local_380._32_8_;
    *(undefined8 *)(local_2a8 + 10) = local_380._40_8_;
    *(undefined8 *)(local_2a8 + 0xc) = local_380._48_8_;
    *(undefined8 *)(local_2a8 + 0xe) = local_380._56_8_;
    local_298 = local_298 + 1;
    local_2a0 = local_2a0 + 1;
    local_2a8 = local_2a8 + 0x10;
    local_140 = local_340;
    uStack_138 = uStack_338;
    uStack_130 = uStack_330;
    uStack_128 = uStack_328;
    uStack_120 = uStack_320;
    uStack_118 = uStack_318;
    uStack_110 = uStack_310;
    uStack_108 = uStack_308;
    local_100 = local_300;
    uStack_f8 = uStack_2f8;
    uStack_f0 = uStack_2f0;
    uStack_e8 = uStack_2e8;
    uStack_e0 = uStack_2e0;
    uStack_d8 = uStack_2d8;
    uStack_d0 = uStack_2d0;
    uStack_c8 = uStack_2c8;
  }
  for (; local_2b4 + 7 < in_ECX; local_2b4 = local_2b4 + 8) {
    local_208 = local_298;
    local_3a0 = *(undefined8 *)*local_298;
    uStack_398 = *(undefined8 *)(*local_298 + 8);
    uStack_390 = *(undefined8 *)(*local_298 + 0x10);
    uStack_388 = *(undefined8 *)(*local_298 + 0x18);
    local_210 = local_2a0;
    local_3c0 = *(undefined8 *)*local_2a0;
    uStack_3b8 = *(undefined8 *)(*local_2a0 + 8);
    uStack_3b0 = *(undefined8 *)(*local_2a0 + 0x10);
    uStack_3a8 = *(undefined8 *)(*local_2a0 + 0x18);
    local_178 = &local_2ad;
    local_180 = &local_3a0;
    local_188 = &local_3c0;
    local_3e0 = vminps_avx(*(undefined1 (*) [32])*local_298,*(undefined1 (*) [32])*local_2a0);
    local_1d8 = local_2a8;
    local_200 = local_3e0._0_8_;
    uStack_1f8 = local_3e0._8_8_;
    uStack_1f0 = local_3e0._16_8_;
    uStack_1e8 = local_3e0._24_8_;
    *(undefined8 *)local_2a8 = local_3e0._0_8_;
    *(undefined8 *)(local_2a8 + 2) = local_3e0._8_8_;
    *(undefined8 *)(local_2a8 + 4) = local_3e0._16_8_;
    *(undefined8 *)(local_2a8 + 6) = local_3e0._24_8_;
    local_298 = (undefined1 (*) [64])(*local_298 + 0x20);
    local_2a0 = (undefined1 (*) [64])(*local_2a0 + 0x20);
    local_2a8 = local_2a8 + 8;
    local_c0 = local_3c0;
    uStack_b8 = uStack_3b8;
    uStack_b0 = uStack_3b0;
    uStack_a8 = uStack_3a8;
    local_a0 = local_3a0;
    uStack_98 = uStack_398;
    uStack_90 = uStack_390;
    uStack_88 = uStack_388;
  }
  for (; local_2ac = in_ECX, local_2b4 + 3 < in_ECX; local_2b4 = local_2b4 + 4) {
    local_1c8 = local_298;
    local_3f0 = *(undefined8 *)*local_298;
    uStack_3e8 = *(undefined8 *)(*local_298 + 8);
    local_1d0 = local_2a0;
    local_400 = *(undefined8 *)*local_2a0;
    uStack_3f8 = *(undefined8 *)(*local_2a0 + 8);
    local_160 = &local_2ad;
    local_168 = &local_3f0;
    local_170 = &local_400;
    auVar1 = vminps_avx(*(undefined1 (*) [16])*local_298,*(undefined1 (*) [16])*local_2a0);
    local_1a8 = local_2a8;
    local_410 = auVar1._0_8_;
    local_1c0 = local_410;
    uStack_408 = auVar1._8_8_;
    uStack_1b8 = uStack_408;
    *(undefined8 *)local_2a8 = local_410;
    *(undefined8 *)(local_2a8 + 2) = uStack_408;
    local_298 = (undefined1 (*) [64])(*local_298 + 0x10);
    local_2a0 = (undefined1 (*) [64])(*local_2a0 + 0x10);
    local_2a8 = local_2a8 + 4;
    local_70 = local_400;
    uStack_68 = uStack_3f8;
    local_60 = local_3f0;
    uStack_58 = uStack_3e8;
  }
  for (; local_2b4 < local_2ac; local_2b4 = local_2b4 + 1) {
    local_148 = &local_2ad;
    local_150 = local_298;
    local_158 = local_2a0;
    pfVar2 = std::min<float>((float *)local_298,(float *)local_2a0);
    *local_2a8 = *pfVar2;
    local_298 = (undefined1 (*) [64])(*local_298 + 4);
    local_2a0 = (undefined1 (*) [64])(*local_2a0 + 4);
    local_2a8 = local_2a8 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_no_broadcast(const float* ptr, const float* ptr1, float* outptr, int size)
{
    const Op op;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_p, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_p, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, *ptr1);
        ptr += 1;
        ptr1 += 1;
        outptr += 1;
    }
}